

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double nifti_cdf2stat(double p,int code,double p1,double p2,double p3)

{
  int iVar1;
  double dVar2;
  pqpair pq;
  pqpair pq_00;
  pqpair pq_01;
  pqpair pVar3;
  pqpair pq_02;
  pqpair pq_03;
  pqpair pq_04;
  pqpair pq_05;
  pqpair pq_06;
  pqpair pq_07;
  double p_1;
  double q;
  int status;
  int which;
  undefined4 uStack_94;
  double bound;
  double local_88;
  double df;
  double x;
  double local_68;
  double ompr;
  double local_58;
  int status_3;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  double local_30;
  
  pVar3.q = 1.0 - p;
  if ((((1.0 < pVar3.q) || (1.0 < p)) || (x = 0.0, p < 0.0)) || (pVar3.q < 0.0))
  goto switchD_001100de_default;
  p_1 = p;
  local_88 = p2;
  df = p1;
  switch(code) {
  case 2:
    pVar3.p = p;
    dVar2 = beta_pq2s(pVar3,p1 * 0.5,p1 * 0.5);
    x = dVar2 + dVar2 + -1.0;
    break;
  case 3:
    pq_02.q = pVar3.q;
    pq_02.p = p;
    dVar2 = student_pq2s(pq_02,p1);
    return dVar2;
  case 4:
    _which = (double)CONCAT44(uStack_94,2);
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar3.q) {
      x = 0.0;
      q = pVar3.q;
      bound = p2;
      cdff(&which,&p_1,&q,&x,&df,&bound,&status,&ompr);
      return x;
    }
    goto LAB_00110816;
  case 5:
    if (p <= 0.0) {
      return -9.99e+37;
    }
    if (0.0 < pVar3.q) {
      q = pVar3.q;
      dVar2 = dinvnr(&p_1,&q);
      return dVar2;
    }
    goto LAB_00110816;
  case 6:
    pq.q = pVar3.q;
    pq.p = p;
    dVar2 = chisq_pq2s(pq,p1);
    return dVar2;
  case 7:
    pq_04.q = pVar3.q;
    pq_04.p = p;
    dVar2 = beta_pq2s(pq_04,p1,p2);
    return dVar2;
  case 8:
    status = 2;
    x = 0.0;
    ompr = 1.0 - p2;
    q = pVar3.q;
    bound = p2;
    cdfbin(&status,&p_1,&q,&x,&df,&bound,&ompr,&status_3,(double *)&which);
    break;
  case 9:
    _which = (double)CONCAT44(uStack_94,2);
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar3.q) {
      x = 0.0;
      q = pVar3.q;
      bound = p2;
      cdfgam(&which,&p_1,&q,&x,&df,&bound,&status,&ompr);
      return x;
    }
    goto LAB_00110816;
  case 10:
    ompr = (double)CONCAT44(ompr._4_4_,2);
    x = 0.0;
    q = pVar3.q;
    cdfpoi((int *)&ompr,&p_1,&q,&x,&df,&which,&bound);
    break;
  case 0xb:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    if (p <= 0.0) {
      dVar2 = -9.99e+37;
    }
    else if (pVar3.q <= 0.0) {
LAB_00110783:
      dVar2 = 9.99e+37;
    }
    else {
      q = pVar3.q;
      dVar2 = dinvnr(&p_1,&q);
      p2 = local_88;
    }
    goto LAB_00110795;
  case 0xc:
    status = 2;
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar3.q) {
      x = 0.0;
      q = pVar3.q;
      _which = p3;
      bound = p2;
      cdffnc(&status,&p_1,&q,&x,&df,&bound,(double *)&which,&status_3,&ompr);
      return x;
    }
    goto LAB_00110816;
  case 0xd:
    _which = (double)CONCAT44(uStack_94,2);
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar3.q) {
      x = 0.0;
      ompr = p2;
      cdfchn(&which,&p_1,&q,&x,&df,&ompr,&status,&bound);
      return x;
    }
LAB_00110816:
    x = 9.99e+37;
    break;
  case 0xe:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    pq_00.q = pVar3.q;
    pq_00.p = p;
    dVar2 = logistic_pq2s(pq_00);
    goto LAB_0011075d;
  case 0xf:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    pq_05.q = pVar3.q;
    pq_05.p = p;
    dVar2 = laplace_pq2s(pq_05);
    goto LAB_0011075d;
  case 0x10:
    if (p2 <= p1) {
      return 9.99e+37;
    }
    dVar2 = (p2 - p1) * p;
    goto LAB_00110799;
  case 0x11:
    if (0.0 < p1) {
      if (p <= 0.0) {
        return -9.99e+37;
      }
      if (0.0 < pVar3.q) {
        pq_01.q = pVar3.q;
        pq_01.p = p;
        local_68 = p;
        local_38 = pVar3.q;
        local_48 = student_pq2s(pq_01,p1);
        if (ABS(local_88) < 1e-08) {
          return local_48;
        }
        uStack_40 = 0;
        local_48 = local_88 * 0.5 + local_48;
        local_58 = 1.0;
        if (1.0 <= ABS(local_48) * 0.1) {
          local_58 = ABS(local_48) * 0.1;
        }
        iVar1 = 1000;
        while (pVar3 = tnonc_s2pq(local_48,p1,local_88), local_68 < pVar3.p) {
          local_48 = local_48 - local_58;
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) {
            return -9.99e+37;
          }
        }
        local_30 = local_58 * 0.5 + local_48;
        iVar1 = 1000;
        do {
          pVar3 = tnonc_s2pq(local_30,p1,local_88);
          if (local_68 <= pVar3.p) {
            p_1 = (local_48 + local_30) * 0.5;
            E0000::small = local_48;
            E0000::big = local_30;
            E0000::absstp = 0.5;
            E0000::relstp = 0.5;
            E0000::stpmul = 5.0;
            E0000::abstol = 1e-50;
            E0000::reltol = 1e-08;
            bound = (double)((ulong)bound & 0xffffffff00000000);
            local_48 = (double)-(ulong)(local_38 < local_68);
            uStack_40 = 0;
            while( true ) {
              E0000(0,(int *)&bound,&p_1,&q,(unsigned_long *)&df,(unsigned_long *)&x,(double *)0x0,
                    (double *)0x0,(double *)0x0,(double *)0x0,(double *)0x0,(double *)0x0,
                    (double *)0x0);
              if (bound._0_4_ != 1) break;
              pVar3 = tnonc_s2pq(p_1,p1,local_88);
              q = (double)(~(ulong)local_48 & (ulong)(local_68 - pVar3.p) |
                          (ulong)(local_38 - pVar3.q) & (ulong)local_48);
            }
            return p_1;
          }
          local_30 = local_30 + local_58;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        goto LAB_00110816;
      }
    }
    x = 9.99e+37;
    break;
  case 0x12:
    if (p2 <= 0.0) goto switchD_001100de_default;
    if (p3 <= 0.0) {
      return 9.99e+37;
    }
    dVar2 = 0.0;
    if ((0.0 < p) && (0.0 < p3)) {
      if (pVar3.q <= 0.0) goto LAB_00110783;
      local_68 = p3;
      dVar2 = log(pVar3.q);
      dVar2 = pow(-dVar2,1.0 / local_68);
      p2 = local_88;
    }
LAB_00110795:
    dVar2 = p2 * dVar2;
LAB_00110799:
    x = dVar2 + p1;
    break;
  case 0x13:
    if ((0.0 < p) && (x = 9.99e+37, 0.0 < pVar3.q)) {
      pq_03.q = pVar3.q;
      pq_03.p = p;
      dVar2 = chisq_pq2s(pq_03,p1);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
        return dVar2;
      }
      x = SQRT(dVar2);
    }
    break;
  case 0x14:
    if (0.0 < p1) {
      if (0.0 < p2) {
        pq_06.q = pVar3.q;
        pq_06.p = p;
        dVar2 = invgauss_pq2s(pq_06,p2 / p1);
        return dVar2 * p1;
      }
      return 9.99e+37;
    }
  default:
switchD_001100de_default:
    x = 9.99e+37;
    break;
  case 0x15:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    pq_07.q = pVar3.q;
    pq_07.p = p;
    dVar2 = extval1_pq2s(pq_07);
LAB_0011075d:
    x = dVar2 * local_88 + p1;
    break;
  case 0x16:
    x = pVar3.q;
    break;
  case 0x17:
    if (pVar3.q <= 0.0) {
      return 9.99e+37;
    }
    dVar2 = log(pVar3.q);
    goto LAB_0011072d;
  case 0x18:
    if (pVar3.q <= 0.0) {
      return 9.99e+37;
    }
    dVar2 = log10(pVar3.q);
LAB_0011072d:
    x = -dVar2;
  }
  return x;
}

Assistant:

double nifti_cdf2stat( double p , int code, double p1,double p2,double p3 )
{
   pqpair pq ;
   pq.p = p ; pq.q = 1.0-p ;
   return pq2stat(pq,code,p1,p2,p3) ;
}